

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

int Curl_pp_getsock(pingpong *pp,curl_socket_t *socks,int numsocks)

{
  connectdata *conn;
  int numsocks_local;
  curl_socket_t *socks_local;
  pingpong *pp_local;
  
  if (numsocks == 0) {
    pp_local._4_4_ = 0;
  }
  else {
    *socks = pp->conn->sock[0];
    if (pp->sendleft == 0) {
      pp_local._4_4_ = 1;
    }
    else {
      pp_local._4_4_ = 0x10000;
    }
  }
  return pp_local._4_4_;
}

Assistant:

int Curl_pp_getsock(struct pingpong *pp,
                    curl_socket_t *socks,
                    int numsocks)
{
  struct connectdata *conn = pp->conn;

  if(!numsocks)
    return GETSOCK_BLANK;

  socks[0] = conn->sock[FIRSTSOCKET];

  if(pp->sendleft) {
    /* write mode */
    return GETSOCK_WRITESOCK(0);
  }

  /* read mode */
  return GETSOCK_READSOCK(0);
}